

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# padding.cpp
# Opt level: O2

void ncnn::copy_make_border_image<signed_char>(Mat *src,Mat *dst,int top,int left,int type,char v)

{
  uint uVar1;
  int iVar2;
  int x_1;
  int iVar3;
  long lVar4;
  ulong uVar5;
  long lVar6;
  long lVar7;
  int iVar8;
  ulong uVar9;
  undefined1 *puVar10;
  size_t sVar11;
  ulong uVar12;
  void *pvVar13;
  int iVar14;
  undefined1 *puVar15;
  int iVar16;
  long lVar17;
  undefined1 *puVar18;
  undefined1 *puVar19;
  
  uVar1 = dst->w;
  lVar17 = (long)(int)uVar1;
  iVar2 = dst->h;
  puVar19 = (undefined1 *)src->data;
  pvVar13 = dst->data;
  lVar4 = (long)left;
  if (type == 0) {
    uVar12 = 0;
    if (0 < (int)uVar1) {
      uVar12 = (ulong)uVar1;
    }
    iVar3 = 0;
    iVar14 = 0;
    if (0 < top) {
      iVar3 = 0;
      iVar14 = top;
    }
    for (; iVar3 != iVar14; iVar3 = iVar3 + 1) {
      for (uVar9 = 0; uVar12 != uVar9; uVar9 = uVar9 + 1) {
        *(char *)((long)pvVar13 + uVar9) = v;
      }
      pvVar13 = (void *)((long)pvVar13 + lVar17);
    }
    uVar9 = 0;
    if (0 < left) {
      uVar9 = (ulong)(uint)left;
    }
    for (; iVar14 < src->h + top; iVar14 = iVar14 + 1) {
      for (uVar5 = 0; uVar9 != uVar5; uVar5 = uVar5 + 1) {
        *(char *)((long)pvVar13 + uVar5) = v;
      }
      sVar11 = (size_t)src->w;
      uVar5 = uVar9;
      if ((long)sVar11 < 0xc) {
        for (; (long)uVar5 < (long)((int)sVar11 + left); uVar5 = uVar5 + 1) {
          *(undefined1 *)((long)pvVar13 + uVar5) = puVar19[uVar5 - lVar4];
          sVar11 = (size_t)(uint)src->w;
        }
      }
      else {
        memcpy((void *)(lVar4 + (long)pvVar13),puVar19,sVar11);
        uVar5 = (ulong)(uint)(src->w + (int)uVar9);
      }
      for (lVar6 = (long)(int)uVar5; lVar6 < lVar17; lVar6 = lVar6 + 1) {
        *(char *)((long)pvVar13 + lVar6) = v;
      }
      puVar19 = puVar19 + src->w;
      pvVar13 = (void *)((long)pvVar13 + lVar17);
    }
    for (; iVar14 < iVar2; iVar14 = iVar14 + 1) {
      for (uVar9 = 0; uVar12 != uVar9; uVar9 = uVar9 + 1) {
        *(char *)((long)pvVar13 + uVar9) = v;
      }
      pvVar13 = (void *)((long)pvVar13 + lVar17);
    }
  }
  puVar18 = puVar19;
  if (type == 1) {
    iVar3 = 0;
    uVar12 = 0;
    if (0 < left) {
      uVar12 = (ulong)(uint)left;
    }
    iVar14 = 0;
    if (0 < top) {
      iVar14 = top;
    }
    puVar15 = (undefined1 *)(uVar12 + (long)pvVar13);
    for (; iVar16 = (int)uVar12, iVar3 != iVar14; iVar3 = iVar3 + 1) {
      for (uVar9 = 0; uVar12 != uVar9; uVar9 = uVar9 + 1) {
        *(undefined1 *)((long)pvVar13 + uVar9) = *puVar19;
      }
      sVar11 = (size_t)src->w;
      uVar9 = uVar12;
      if ((long)sVar11 < 0xc) {
        for (; (long)uVar9 < (long)((int)sVar11 + left); uVar9 = uVar9 + 1) {
          *(undefined1 *)((long)pvVar13 + uVar9) = puVar19[uVar9 - lVar4];
          sVar11 = (size_t)(uint)src->w;
        }
      }
      else {
        memcpy((void *)(lVar4 + (long)pvVar13),puVar19,sVar11);
        uVar9 = (ulong)(uint)(src->w + iVar16);
      }
      for (lVar6 = (long)(int)uVar9; lVar6 < lVar17; lVar6 = lVar6 + 1) {
        *(undefined1 *)((long)pvVar13 + lVar6) = puVar19[(long)src->w + -1];
      }
      pvVar13 = (void *)((long)pvVar13 + lVar17);
      puVar15 = puVar15 + lVar17;
    }
    for (; iVar14 < src->h + top; iVar14 = iVar14 + 1) {
      for (uVar9 = 0; uVar12 != uVar9; uVar9 = uVar9 + 1) {
        *(undefined1 *)((long)pvVar13 + uVar9) = *puVar19;
      }
      sVar11 = (size_t)src->w;
      uVar9 = uVar12;
      if ((long)sVar11 < 0xc) {
        for (; (long)uVar9 < (long)((int)sVar11 + left); uVar9 = uVar9 + 1) {
          *(undefined1 *)((long)pvVar13 + uVar9) = puVar19[uVar9 - lVar4];
          sVar11 = (size_t)(uint)src->w;
        }
      }
      else {
        memcpy((void *)(lVar4 + (long)pvVar13),puVar19,sVar11);
        uVar9 = (ulong)(uint)(src->w + iVar16);
      }
      for (lVar6 = (long)(int)uVar9; lVar6 < lVar17; lVar6 = lVar6 + 1) {
        *(undefined1 *)((long)pvVar13 + lVar6) = puVar19[(long)src->w + -1];
      }
      puVar19 = puVar19 + src->w;
      pvVar13 = (void *)((long)pvVar13 + lVar17);
      puVar15 = puVar15 + lVar17;
    }
    iVar3 = src->w;
    puVar18 = puVar19 + -(long)iVar3;
    for (; iVar14 < iVar2; iVar14 = iVar14 + 1) {
      for (uVar9 = 0; uVar12 != uVar9; uVar9 = uVar9 + 1) {
        *(undefined1 *)((long)pvVar13 + uVar9) = *puVar18;
      }
      sVar11 = (size_t)src->w;
      uVar9 = uVar12;
      puVar10 = puVar15;
      if ((long)sVar11 < 0xc) {
        for (; (long)uVar9 < (long)((int)sVar11 + left); uVar9 = uVar9 + 1) {
          *puVar10 = puVar19[uVar9 - (iVar3 + lVar4)];
          sVar11 = (size_t)(uint)src->w;
          puVar10 = puVar10 + 1;
        }
      }
      else {
        memcpy((void *)(lVar4 + (long)pvVar13),puVar18,sVar11);
        uVar9 = (ulong)(uint)(src->w + iVar16);
      }
      for (lVar6 = (long)(int)uVar9; lVar6 < lVar17; lVar6 = lVar6 + 1) {
        *(undefined1 *)((long)pvVar13 + lVar6) = puVar18[(long)src->w + -1];
      }
      pvVar13 = (void *)((long)pvVar13 + lVar17);
      puVar15 = puVar15 + lVar17;
    }
  }
  if (type == 2) {
    uVar12 = (ulong)(uint)src->w;
    puVar18 = puVar18 + src->w * top;
    iVar3 = 0;
    uVar9 = 0;
    if (0 < left) {
      uVar9 = (ulong)(uint)left;
    }
    iVar14 = 0;
    if (0 < top) {
      iVar14 = top;
    }
    puVar19 = (undefined1 *)((long)pvVar13 + uVar9);
    lVar6 = -lVar4;
    iVar16 = left + -2;
    for (; iVar8 = (int)uVar9, iVar3 != iVar14; iVar3 = iVar3 + 1) {
      puVar15 = puVar18 + lVar4;
      for (uVar12 = 0; uVar9 != uVar12; uVar12 = uVar12 + 1) {
        *(undefined1 *)((long)pvVar13 + uVar12) = *puVar15;
        puVar15 = puVar15 + -1;
      }
      sVar11 = (size_t)src->w;
      uVar12 = uVar9;
      if ((long)sVar11 < 0xc) {
        for (; (long)uVar12 < (long)((int)sVar11 + left); uVar12 = uVar12 + 1) {
          *(undefined1 *)((long)pvVar13 + uVar12) = puVar18[uVar12 + lVar6];
          sVar11 = (size_t)(uint)src->w;
        }
      }
      else {
        memcpy((void *)(lVar4 + (long)pvVar13),puVar18,sVar11);
        uVar12 = (ulong)(uint)(src->w + iVar8);
      }
      iVar8 = iVar16 - (int)uVar12;
      for (lVar7 = (long)(int)uVar12; lVar7 < lVar17; lVar7 = lVar7 + 1) {
        *(undefined1 *)((long)pvVar13 + lVar7) = puVar18[iVar8 + src->w * 2];
        iVar8 = iVar8 + -1;
      }
      pvVar13 = (void *)((long)pvVar13 + lVar17);
      uVar12 = (ulong)src->w;
      puVar18 = puVar18 + -uVar12;
      puVar19 = puVar19 + lVar17;
    }
    for (; iVar14 < src->h + top; iVar14 = iVar14 + 1) {
      puVar15 = puVar18 + lVar4;
      for (uVar12 = 0; uVar9 != uVar12; uVar12 = uVar12 + 1) {
        *(undefined1 *)((long)pvVar13 + uVar12) = *puVar15;
        puVar15 = puVar15 + -1;
      }
      sVar11 = (size_t)src->w;
      uVar12 = uVar9;
      if ((long)sVar11 < 0xc) {
        for (; (long)uVar12 < (long)((int)sVar11 + left); uVar12 = uVar12 + 1) {
          *(undefined1 *)((long)pvVar13 + uVar12) = puVar18[uVar12 + lVar6];
          sVar11 = (size_t)(uint)src->w;
        }
      }
      else {
        memcpy((void *)(lVar4 + (long)pvVar13),puVar18,sVar11);
        uVar12 = (ulong)(uint)(src->w + iVar8);
      }
      lVar7 = (long)(int)uVar12;
      iVar3 = iVar16 - (int)uVar12;
      while( true ) {
        uVar1 = src->w;
        uVar12 = (ulong)uVar1;
        if (lVar17 <= lVar7) break;
        *(undefined1 *)((long)pvVar13 + lVar7) = puVar18[(int)(iVar3 + uVar1 * 2)];
        lVar7 = lVar7 + 1;
        iVar3 = iVar3 + -1;
      }
      puVar18 = puVar18 + (int)uVar1;
      pvVar13 = (void *)((long)pvVar13 + lVar17);
      puVar19 = puVar19 + lVar17;
    }
    puVar18 = puVar18 + -(long)((int)uVar12 * 2);
    for (; iVar14 < iVar2; iVar14 = iVar14 + 1) {
      puVar15 = puVar18 + lVar4;
      for (uVar12 = 0; uVar9 != uVar12; uVar12 = uVar12 + 1) {
        *(undefined1 *)((long)pvVar13 + uVar12) = *puVar15;
        puVar15 = puVar15 + -1;
      }
      sVar11 = (size_t)src->w;
      uVar12 = uVar9;
      puVar15 = puVar19;
      if ((long)sVar11 < 0xc) {
        for (; (long)uVar12 < (long)((int)sVar11 + left); uVar12 = uVar12 + 1) {
          *puVar15 = puVar18[uVar12 + lVar6];
          sVar11 = (size_t)(uint)src->w;
          puVar15 = puVar15 + 1;
        }
      }
      else {
        memcpy((void *)(lVar4 + (long)pvVar13),puVar18,sVar11);
        uVar12 = (ulong)(uint)(src->w + iVar8);
      }
      iVar3 = iVar16 - (int)uVar12;
      for (lVar7 = (long)(int)uVar12; lVar7 < lVar17; lVar7 = lVar7 + 1) {
        *(undefined1 *)((long)pvVar13 + lVar7) = puVar18[iVar3 + src->w * 2];
        iVar3 = iVar3 + -1;
      }
      pvVar13 = (void *)((long)pvVar13 + lVar17);
      puVar18 = puVar18 + -(long)src->w;
      puVar19 = puVar19 + lVar17;
    }
  }
  return;
}

Assistant:

static void copy_make_border_image(const Mat& src, Mat& dst, int top, int left, int type, T v)
{
    int w = dst.w;
    int h = dst.h;

    const T* ptr = src;
    T* outptr = dst;

    if (type == 0)
    {
        int y = 0;
        // fill top
        for (; y < top; y++)
        {
            int x = 0;
            for (; x < w; x++)
            {
                outptr[x] = v;
            }
            outptr += w;
        }
        // fill center
        for (; y < (top + src.h); y++)
        {
            int x = 0;
            for (; x < left; x++)
            {
                outptr[x] = v;
            }
            if (src.w < 12)
            {
                for (; x < (left + src.w); x++)
                {
                    outptr[x] = ptr[x - left];
                }
            }
            else
            {
                memcpy(outptr + left, ptr, src.w * sizeof(T));
                x += src.w;
            }
            for (; x < w; x++)
            {
                outptr[x] = v;
            }
            ptr += src.w;
            outptr += w;
        }
        // fill bottom
        for (; y < h; y++)
        {
            int x = 0;
            for (; x < w; x++)
            {
                outptr[x] = v;
            }
            outptr += w;
        }
    }

    if (type == 1)
    {
        int y = 0;
        // fill top
        for (; y < top; y++)
        {
            int x = 0;
            for (; x < left; x++)
            {
                outptr[x] = ptr[0];
            }
            if(src.w < 12)
            {
                for (; x < (left + src.w); x++)
                {
                    outptr[x] = ptr[x - left];
                }
            }
            else
            {
                memcpy(outptr + left, ptr, src.w * sizeof(T));
                x += src.w;
            }
            for (; x < w; x++)
            {
                outptr[x] = ptr[src.w - 1];
            }
            outptr += w;
        }
        // fill center
        for (; y < (top + src.h); y++)
        {
            int x = 0;
            for (; x < left; x++)
            {
                outptr[x] = ptr[0];
            }
            if(src.w < 12)
            {
                for (; x < (left + src.w); x++)
                {
                    outptr[x] = ptr[x - left];
                }
            }
            else
            {
                memcpy(outptr + left, ptr, src.w * sizeof(T));
                x += src.w;
            }
            for (; x < w; x++)
            {
                outptr[x] = ptr[src.w - 1];
            }
            ptr += src.w;
            outptr += w;
        }
        // fill bottom
        ptr -= src.w;
        for (; y < h; y++)
        {
            int x = 0;
            for (; x < left; x++)
            {
                outptr[x] = ptr[0];
            }
            if(src.w < 12)
            {
                for (; x < (left + src.w); x++)
                {
                    outptr[x] = ptr[x - left];
                }
            }
            else
            {
                memcpy(outptr + left, ptr, src.w * sizeof(T));
                x += src.w;
            }
            for (; x < w; x++)
            {
                outptr[x] = ptr[src.w - 1];
            }
            outptr += w;
        }
    }

    if (type == 2)
    {
        int y = 0;
        // fill top
        ptr += top * src.w;
        for (; y < top; y++)
        {
            int x = 0;
            for (; x < left; x++)
            {
                outptr[x] = ptr[left - x];
            }
            if(src.w < 12)
            {
                for (; x < (left + src.w); x++)
                {
                    outptr[x] = ptr[x - left];
                }
            }
            else
            {
                memcpy(outptr + left, ptr, src.w * sizeof(T));
                x += src.w;
            }
            for (; x < w; x++)
            {
                outptr[x] = ptr[src.w - (x - left - src.w) - 2];
            }
            outptr += w;
            ptr -= src.w;
        }
        // fill center
        for (; y < (top + src.h); y++)
        {
            int x = 0;
            for (; x < left; x++)
            {
                outptr[x] = ptr[left - x];
            }
            if(src.w < 12)
            {
                for (; x < (left + src.w); x++)
                {
                    outptr[x] = ptr[x - left];
                }
            }
            else
            {
                memcpy(outptr + left, ptr, src.w * sizeof(T));
                x += src.w;
            }
            for (; x < w; x++)
            {
                outptr[x] = ptr[src.w - (x - left - src.w) - 2];
            }
            ptr += src.w;
            outptr += w;
        }
        // fill bottom
        ptr -= 2 * src.w;
        for (; y < h; y++)
        {
            int x = 0;
            for (; x < left; x++)
            {
                outptr[x] = ptr[left - x];
            }
            if(src.w < 12)
            {
                for (; x < (left + src.w); x++)
                {
                    outptr[x] = ptr[x - left];
                }
            }
            else
            {
                memcpy(outptr + left, ptr, src.w * sizeof(T));
                x += src.w;
            }
            for (; x < w; x++)
            {
                outptr[x] = ptr[src.w - (x - left - src.w) - 2];
            }
            outptr += w;
            ptr -= src.w;
        }
    }

}